

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O0

int connection_start_endpoint
              (ENDPOINT_HANDLE endpoint,ON_ENDPOINT_FRAME_RECEIVED on_endpoint_frame_received,
              ON_CONNECTION_STATE_CHANGED on_connection_state_changed,void *context)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l;
  int result;
  void *context_local;
  ON_CONNECTION_STATE_CHANGED on_connection_state_changed_local;
  ON_ENDPOINT_FRAME_RECEIVED on_endpoint_frame_received_local;
  ENDPOINT_HANDLE endpoint_local;
  
  if (((endpoint == (ENDPOINT_HANDLE)0x0) ||
      (on_endpoint_frame_received == (ON_ENDPOINT_FRAME_RECEIVED)0x0)) ||
     (on_connection_state_changed == (ON_CONNECTION_STATE_CHANGED)0x0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                ,"connection_start_endpoint",0x79d,1,
                "Bad arguments: endpoint = %p, on_endpoint_frame_received = %p, on_connection_state_changed = %p"
                ,endpoint,on_endpoint_frame_received,on_connection_state_changed);
    }
    l._4_4_ = 0x79e;
  }
  else {
    endpoint->on_endpoint_frame_received = on_endpoint_frame_received;
    endpoint->on_connection_state_changed = on_connection_state_changed;
    endpoint->callback_context = context;
    l._4_4_ = 0;
  }
  return l._4_4_;
}

Assistant:

int connection_start_endpoint(ENDPOINT_HANDLE endpoint, ON_ENDPOINT_FRAME_RECEIVED on_endpoint_frame_received, ON_CONNECTION_STATE_CHANGED on_connection_state_changed, void* context)
{
    int result;

    if ((endpoint == NULL) ||
        (on_endpoint_frame_received == NULL) ||
        (on_connection_state_changed == NULL))
    {
        LogError("Bad arguments: endpoint = %p, on_endpoint_frame_received = %p, on_connection_state_changed = %p",
            endpoint, on_endpoint_frame_received, on_connection_state_changed);
        result = MU_FAILURE;
    }
    else
    {
        endpoint->on_endpoint_frame_received = on_endpoint_frame_received;
        endpoint->on_connection_state_changed = on_connection_state_changed;
        endpoint->callback_context = context;

        result = 0;
    }

    return result;
}